

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::
     PrintTupleTo<std::tuple<long(*)(int_const*,int_const*,long,long*,int),long(*)(int_const*,int_const*,long,long*,int),aom_bit_depth>,2ul>
               (long t,ostream *param_2)

{
  FunctionPointerPrinter::PrintValue<long(int_const*,int_const*,long,long*,int),void>
            (*(_func_long_int_ptr_int_ptr_long_long_ptr_int **)(t + 0x10),param_2);
  std::__ostream_insert<char,std::char_traits<char>>(param_2,", ",2);
  FunctionPointerPrinter::PrintValue<long(int_const*,int_const*,long,long*,int),void>
            (*(_func_long_int_ptr_int_ptr_long_long_ptr_int **)(t + 8),param_2);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}